

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

char * zt_cstr_basename(char *npath,size_t len,char *path,char *suffix)

{
  char *in_RCX;
  ssize_t in_RDX;
  size_t in_RSI;
  char *in_RDI;
  ssize_t unaff_retaddr;
  ssize_t end;
  ssize_t start;
  
  memset(in_RDI,0,in_RSI);
  zt_cstr_rfind(in_RDI,in_RSI,in_RDX,in_RCX);
  if (in_RCX != (char *)0x0) {
    zt_cstr_rfind(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  zt_cstr_copy((char *)start,end,unaff_retaddr,in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

char*
zt_cstr_basename(char *npath, size_t len, const char *path, const char *suffix) {
    ssize_t   start;
    ssize_t   end;

    zt_assert(npath);
    zt_assert(path);

    memset(npath, '\0', len);

    if ((start = zt_cstr_rfind(path, 0, -1, PATH_SEPERATOR)) != -1) {
        start = start + strlen(PATH_SEPERATOR);
    } else {
        start = 0;
    }

    if (suffix) {
        end = zt_cstr_rfind(path, start, -1, suffix);
        if (end > 0 && path[end] == '.') {
            end--;
        }
    } else {
        end = -1;
    }

    zt_cstr_copy(path, start, end, npath, len);
    return npath;
}